

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.cc
# Opt level: O2

void __thiscall kratos::IRVisitor::visit_generator_root(IRVisitor *this,Generator *generator)

{
  shared_ptr<kratos::Generator> *child;
  undefined1 auVar1 [8];
  undefined1 local_38 [8];
  vector<std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
  children;
  
  Generator::get_child_generators
            ((vector<std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
              *)local_38,generator);
  (*this->_vptr_IRVisitor[0x23])(this,generator);
  this->level = this->level + 1;
  for (auVar1 = local_38;
      auVar1 != (undefined1  [8])
                children.
                super__Vector_base<std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      auVar1 = (undefined1  [8])((long)auVar1 + 0x10)) {
    (*this->_vptr_IRVisitor[2])
              (this,(((pointer)auVar1)->
                    super___shared_ptr<kratos::Generator,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
  }
  this->level = this->level - 1;
  std::
  vector<std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>::
  ~vector((vector<std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
           *)local_38);
  return;
}

Assistant:

void IRVisitor::visit_generator_root(Generator *generator) {
    auto children = generator->get_child_generators();
    generator->accept_generator(this);
    level++;
    for (auto &child : children) visit_generator_root(child.get());
    level--;
}